

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

void __thiscall ON_PolyCurve::DestroyRuntimeCache(ON_PolyCurve *this,bool bDelete)

{
  uint uVar1;
  ON_PolyCurve *pOVar2;
  ulong uVar3;
  ulong uVar4;
  
  ON_Curve::DestroyRuntimeCache(&this->super_ON_Curve,bDelete);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pOVar2 = (ON_PolyCurve *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4];
    if (pOVar2 != this && pOVar2 != (ON_PolyCurve *)0x0) {
      (*(pOVar2->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                (pOVar2,(ulong)bDelete);
    }
  }
  return;
}

Assistant:

void ON_PolyCurve::DestroyRuntimeCache( bool bDelete )
{
  ON_Curve::DestroyRuntimeCache(bDelete);
  int i, count = m_segment.Count();
  for ( i = 0; i < count; i++ )
  {
    ON_Curve* segment_curve = m_segment[i];
    if ( 0 != segment_curve && this != segment_curve )
      segment_curve->DestroyRuntimeCache(bDelete);
  }
}